

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall
QGraphicsItemPrivate::invalidateChildGraphicsEffectsRecursively
          (QGraphicsItemPrivate *this,InvalidateReason reason)

{
  QGraphicsItemPrivate *this_00;
  int i;
  ulong uVar1;
  
  if ((this->field_0x169 & 2) != 0) {
    for (uVar1 = 0; uVar1 < (ulong)(this->children).d.size; uVar1 = uVar1 + 1) {
      this_00 = ((this->children).d.ptr[uVar1]->d_ptr).d;
      if ((reason != OpacityChanged) || ((this_00->field_0x164 & 0x40) == 0)) {
        if (this_00->graphicsEffect != (QGraphicsEffect *)0x0) {
          this_00->field_0x168 = this_00->field_0x168 | 1;
          QGraphicsEffectSourcePrivate::invalidateCache
                    (*(QGraphicsEffectSourcePrivate **)
                      (*(long *)(*(long *)&this_00->graphicsEffect->field_0x8 + 0x78) + 8),
                     SourceChanged);
        }
        invalidateChildGraphicsEffectsRecursively(this_00,reason);
      }
    }
  }
  return;
}

Assistant:

void QGraphicsItemPrivate::invalidateChildGraphicsEffectsRecursively(QGraphicsItemPrivate::InvalidateReason reason)
{
    if (!mayHaveChildWithGraphicsEffect)
        return;

    for (int i = 0; i < children.size(); ++i) {
        QGraphicsItemPrivate *childPrivate = children.at(i)->d_ptr.data();
        if (reason == OpacityChanged && (childPrivate->flags & QGraphicsItem::ItemIgnoresParentOpacity))
            continue;
        if (childPrivate->graphicsEffect) {
            childPrivate->notifyInvalidated = 1;
            static_cast<QGraphicsItemEffectSourcePrivate *>(childPrivate->graphicsEffect->d_func()->source->d_func())->invalidateCache();
        }

        childPrivate->invalidateChildGraphicsEffectsRecursively(reason);
    }
}